

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr.cpp
# Opt level: O2

Ref<embree::Image> __thiscall embree::loadEXR(embree *this,FileName *fileName)

{
  int iVar1;
  ImageT<embree::Col4<float>_> *this_00;
  ostream *poVar2;
  runtime_error *this_01;
  ssize_t x;
  size_t sVar3;
  size_t sVar4;
  size_t width_00;
  long lVar5;
  size_t sVar6;
  char *err;
  int height;
  int width;
  long local_98;
  float *rgba;
  string local_88;
  Image *local_68;
  size_t local_60;
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  err = (char *)0x0;
  std::__cxx11::string::string((string *)&local_88,(string *)fileName);
  iVar1 = LoadEXR(&rgba,&width,&height,
                  (char *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_),
                  &err);
  std::__cxx11::string::~string((string *)&local_88);
  if (iVar1 == 0) {
    this_00 = (ImageT<embree::Col4<float>_> *)::operator_new(0x48);
    width_00 = (size_t)width;
    sVar3 = (size_t)height;
    std::__cxx11::string::string((string *)&local_88,(string *)fileName);
    ImageT<embree::Col4<float>_>::ImageT(this_00,width_00,sVar3,&local_88);
    *(ImageT<embree::Col4<float>_> **)this = this_00;
    (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
    local_68 = (Image *)this;
    std::__cxx11::string::~string((string *)&local_88);
    sVar4 = 0;
    sVar6 = 0;
    if (0 < (long)width_00) {
      sVar6 = width_00;
    }
    local_60 = sVar3;
    if ((long)sVar3 < 1) {
      local_60 = sVar4;
    }
    local_58 = width_00 << 4;
    local_98 = 4;
    for (; sVar4 != local_60; sVar4 = sVar4 + 1) {
      lVar5 = local_98;
      for (sVar3 = 0; sVar6 != sVar3; sVar3 = sVar3 + 1) {
        local_88._M_dataplus._M_p._0_4_ = *(undefined4 *)((long)rgba + lVar5 + -4);
        local_88._M_dataplus._M_p._4_4_ = (undefined4)*(undefined8 *)((long)rgba + lVar5);
        local_88._M_string_length._0_4_ =
             (undefined4)((ulong)*(undefined8 *)((long)rgba + lVar5) >> 0x20);
        local_88._M_string_length._4_4_ = 0x3f800000;
        (*(this_00->super_Image).super_RefCount._vptr_RefCount[5])(this_00,sVar3,sVar4,&local_88);
        lVar5 = lVar5 + 0x10;
      }
      local_98 = local_98 + local_58;
    }
    free(rgba);
    return (Ref<embree::Image>)local_68;
  }
  if (err != (char *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERR: ");
    std::operator<<(poVar2,err);
    free(err);
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_50,(string *)fileName);
  std::operator+(&local_88,"Could not load image ",&local_50);
  std::runtime_error::runtime_error(this_01,(string *)&local_88);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<Image> loadEXR(const FileName& fileName)
  {
    float* rgba; // width * height * RGBA
    int width;
    int height;
    const char* err = NULL; // or nullptr in C++11

    int ret = LoadEXR(&rgba, &width, &height, fileName.str().c_str(), &err);
    if (ret != TINYEXR_SUCCESS) {
      if (err) {
        std::cerr << "ERR: " << err;
        FreeEXRErrorMessage(err);
      }
      THROW_RUNTIME_ERROR("Could not load image " + fileName.str())
    }

    /* create image and fill with data */
    Ref<Image> img = new Image4f(width,height,fileName);

    for (ssize_t y=0; y<height; y++) {
      for (ssize_t x=0; x<width; x++) {
        float* pix = rgba + (y * width + x) * 4;
        img->set(x,y,Color4(pix[0],pix[1],pix[2],1.0f));
      }
    }
    free(rgba);
    return img;
  }